

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_utils.cc
# Opt level: O0

bool draco::parser::ParseFloat(DecoderBuffer *buffer,float *value)

{
  bool bVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  float *in_RSI;
  DecoderBuffer *in_RDI;
  double dVar5;
  int32_t exponent;
  string text;
  double fraction;
  double v;
  bool have_digits;
  int sign;
  char ch;
  char *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff84;
  undefined1 in_stack_ffffffffffffff85;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  DecoderBuffer *in_stack_ffffffffffffff88;
  DecoderBuffer *buffer_00;
  DecoderBuffer local_58;
  int local_20;
  char local_19;
  float *local_18;
  DecoderBuffer *local_10;
  byte local_1;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  bVar1 = DecoderBuffer::Peek<char>(in_RDI,&local_19);
  if (!bVar1) {
    local_1 = 0;
    goto LAB_0012ed67;
  }
  local_20 = GetSignValue(local_19);
  if (local_20 == 0) {
    local_20 = 1;
  }
  else {
    DecoderBuffer::Advance(local_10,1);
  }
  local_58._55_1_ = 0;
  local_58.bit_decoder_.bit_offset_ = 0;
  while( true ) {
    bVar2 = DecoderBuffer::Peek<char>(local_10,&local_19);
    bVar1 = false;
    if ((bVar2) && (bVar1 = false, '/' < local_19)) {
      bVar1 = local_19 < ':';
    }
    if (!bVar1) break;
    local_58.bit_decoder_.bit_offset_ =
         (size_t)((double)(local_19 + -0x30) + (double)local_58.bit_decoder_.bit_offset_ * 10.0);
    DecoderBuffer::Advance(local_10,1);
    local_58._55_1_ = 1;
  }
  if (local_19 == '.') {
    DecoderBuffer::Advance(local_10,1);
    local_58.bit_decoder_.bit_buffer_end_ = (uint8_t *)0x3ff0000000000000;
    while( true ) {
      bVar2 = DecoderBuffer::Peek<char>(local_10,&local_19);
      bVar1 = false;
      if ((bVar2) && (bVar1 = false, '/' < local_19)) {
        bVar1 = local_19 < ':';
      }
      if (!bVar1) break;
      local_58.bit_decoder_.bit_buffer_end_ =
           (uint8_t *)((double)local_58.bit_decoder_.bit_buffer_end_ * 0.1);
      local_58.bit_decoder_.bit_offset_ =
           (size_t)((double)(local_19 + -0x30) * (double)local_58.bit_decoder_.bit_buffer_end_ +
                   (double)local_58.bit_decoder_.bit_offset_);
      DecoderBuffer::Advance(local_10,1);
      local_58._55_1_ = 1;
    }
  }
  if ((local_58._55_1_ & 1) == 0) {
    buffer_00 = &local_58;
    std::__cxx11::string::string((string *)buffer_00);
    bVar1 = ParseString(buffer_00,
                        (string *)
                        CONCAT17(in_stack_ffffffffffffff87,
                                 CONCAT16(in_stack_ffffffffffffff86,
                                          CONCAT15(in_stack_ffffffffffffff85,
                                                   CONCAT14(in_stack_ffffffffffffff84,
                                                            in_stack_ffffffffffffff80)))));
    if (bVar1) {
      uVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_ffffffffffffff87,
                                       CONCAT16(in_stack_ffffffffffffff86,
                                                CONCAT15(in_stack_ffffffffffffff85,
                                                         CONCAT14(in_stack_ffffffffffffff84,
                                                                  in_stack_ffffffffffffff80)))),
                              in_stack_ffffffffffffff78);
      if (((bool)uVar3) ||
         (uVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(uVar3,CONCAT16(in_stack_ffffffffffffff86,
                                                             CONCAT15(in_stack_ffffffffffffff85,
                                                                      CONCAT14(
                                                  in_stack_ffffffffffffff84,
                                                  in_stack_ffffffffffffff80)))),
                                  in_stack_ffffffffffffff78), (bool)uVar4)) {
        local_58.bit_decoder_.bit_offset_ = (size_t)std::numeric_limits<double>::infinity();
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(uVar3,CONCAT16(uVar4,CONCAT15(in_stack_ffffffffffffff85,
                                                                        CONCAT14(
                                                  in_stack_ffffffffffffff84,
                                                  in_stack_ffffffffffffff80)))),
                                in_stack_ffffffffffffff78);
        if ((!bVar1) &&
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(uVar3,CONCAT16(uVar4,CONCAT15(bVar1,CONCAT14(
                                                  in_stack_ffffffffffffff84,
                                                  in_stack_ffffffffffffff80)))),
                                    in_stack_ffffffffffffff78), !bVar1)) {
          local_1 = 0;
          bVar1 = true;
          goto LAB_0012ec8c;
        }
        local_58.bit_decoder_.bit_offset_ = (size_t)nan("");
      }
      bVar1 = false;
    }
    else {
      local_1 = 0;
      bVar1 = true;
    }
LAB_0012ec8c:
    std::__cxx11::string::~string((string *)&local_58);
    if (bVar1) goto LAB_0012ed67;
  }
  else if ((local_19 == 'e') || (local_19 == 'E')) {
    DecoderBuffer::Advance(local_10,1);
    bVar1 = ParseSignedInt(in_stack_ffffffffffffff88,
                           (int32_t *)
                           CONCAT17(in_stack_ffffffffffffff87,
                                    CONCAT16(in_stack_ffffffffffffff86,
                                             CONCAT15(in_stack_ffffffffffffff85,
                                                      CONCAT14(in_stack_ffffffffffffff84,
                                                               in_stack_ffffffffffffff80)))));
    if (!bVar1) {
      local_1 = 0;
      goto LAB_0012ed67;
    }
    dVar5 = pow(10.0,0.0);
    local_58.bit_decoder_.bit_offset_ = (size_t)(dVar5 * (double)local_58.bit_decoder_.bit_offset_);
  }
  if (local_20 < 0) {
    local_58.bit_decoder_.bit_offset_ = (size_t)-(double)local_58.bit_decoder_.bit_offset_;
  }
  *local_18 = (float)(double)local_58.bit_decoder_.bit_offset_;
  local_1 = 1;
LAB_0012ed67:
  return (bool)(local_1 & 1);
}

Assistant:

bool ParseFloat(DecoderBuffer *buffer, float *value) {
  // Read optional sign.
  char ch;
  if (!buffer->Peek(&ch)) {
    return false;
  }
  int sign = GetSignValue(ch);
  if (sign != 0) {
    buffer->Advance(1);
  } else {
    sign = 1;
  }

  // Parse integer component.
  bool have_digits = false;
  double v = 0.0;
  while (buffer->Peek(&ch) && ch >= '0' && ch <= '9') {
    v *= 10.0;
    v += (ch - '0');
    buffer->Advance(1);
    have_digits = true;
  }
  if (ch == '.') {
    // Parse fractional component.
    buffer->Advance(1);
    double fraction = 1.0;
    while (buffer->Peek(&ch) && ch >= '0' && ch <= '9') {
      fraction *= 0.1;
      v += (ch - '0') * fraction;
      buffer->Advance(1);
      have_digits = true;
    }
  }

  if (!have_digits) {
    // Check for special constants (inf, nan, ...).
    std::string text;
    if (!ParseString(buffer, &text)) {
      return false;
    }
    if (text == "inf" || text == "Inf") {
      v = std::numeric_limits<double>::infinity();
    } else if (text == "nan" || text == "NaN") {
      v = nan("");
    } else {
      // Invalid string.
      return false;
    }
  } else {
    // Handle exponent if present.
    if (ch == 'e' || ch == 'E') {
      buffer->Advance(1);  // Skip 'e' marker.

      // Parse integer exponent.
      int32_t exponent = 0;
      if (!ParseSignedInt(buffer, &exponent)) {
        return false;
      }

      // Apply exponent scaling to value.
      v *= pow(static_cast<double>(10.0), exponent);
    }
  }

  *value = (sign < 0) ? static_cast<float>(-v) : static_cast<float>(v);
  return true;
}